

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O1

int __thiscall cppcms::http::impl::file_buffer::write_buffer(file_buffer *this)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  int iVar4;
  size_t __n;
  
  iVar4 = -1;
  if (this->closed_ == false) {
    if (this->f_ == (FILE *)0x0) {
      get_name(this);
      pFVar2 = fopen((this->name_)._M_dataplus._M_p,"w+b");
      this->f_ = (FILE *)pFVar2;
      if (pFVar2 == (FILE *)0x0) {
        return -1;
      }
    }
    iVar1 = fseek((FILE *)this->f_,0,2);
    if (iVar1 == 0) {
      __n = *(long *)&this->field_0x28 - (long)*(void **)&this->field_0x20;
      if ((__n != 0) &&
         (sVar3 = fwrite(*(void **)&this->field_0x20,1,__n,(FILE *)this->f_), sVar3 != __n)) {
        return -1;
      }
      this->file_size_ = this->file_size_ + __n;
      *(undefined8 *)&this->field_0x28 = *(undefined8 *)&this->field_0x20;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int write_buffer()
	{
		if(closed_)
			return -1;
		if(!f_) {
			get_name();
			f_ = booster::nowide::fopen(name_.c_str(),"w+b");
			if(!f_)
				return -1;
		}
		if(fseek(f_,0,SEEK_END) !=0)
			return -1;
		size_t size = pptr()-pbase();
		if(size != 0 && fwrite(pbase(),1,size,f_)!=size)
			return -1;
		file_size_ += size;
		setp(pbase(),epptr());
		return 0;
	}